

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

int __thiscall libtorrent::aux::session_impl::next_port(session_impl *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  uVar2 = session_settings::get_int(&this->m_settings,0x4026);
  iVar3 = session_settings::get_int(&this->m_settings,0x4027);
  uVar1 = this->m_next_port;
  uVar4 = uVar1;
  if ((int)(iVar3 + uVar2) < (int)uVar1) {
    uVar4 = uVar2;
  }
  if ((int)uVar1 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar1 = uVar4 + 1;
  if ((int)(iVar3 + uVar2) <= (int)uVar4) {
    uVar1 = uVar2;
  }
  this->m_next_port = uVar1;
  session_log(this," *** BINDING OUTGOING CONNECTION [ port: %d ]",(ulong)uVar4);
  return uVar4;
}

Assistant:

int session_impl::next_port() const
	{
		int start = m_settings.get_int(settings_pack::outgoing_port);
		int num = m_settings.get_int(settings_pack::num_outgoing_ports);
		std::pair<int, int> out_ports(start, start + num);
		if (m_next_port < out_ports.first || m_next_port > out_ports.second)
			m_next_port = out_ports.first;

		int port = m_next_port;
		++m_next_port;
		if (m_next_port > out_ports.second) m_next_port = out_ports.first;
#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** BINDING OUTGOING CONNECTION [ port: %d ]", port);
#endif
		return port;
	}